

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O1

void __thiscall Clasp::SatElite::doExtendModel(SatElite *this,ValueVec *m,LitVec *unconstr)

{
  uint uVar1;
  pointer puVar2;
  pointer pLVar3;
  pointer pLVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  Clause *pCVar14;
  uint uVar15;
  Literal local_34;
  
  pCVar14 = (this->super_SatPreprocessor).elimTop_;
  if (pCVar14 != (Clause *)0x0) {
    uVar7 = (unconstr->ebo_).size;
    uVar15 = 0;
    do {
      uVar1 = pCVar14->lits_[0].rep_;
      uVar5 = uVar1 >> 2;
      if (-1 < *(int *)&pCVar14->field_0x8) {
        (m->ebo_).buf[uVar5] = '\x04';
      }
      bVar6 = true;
      uVar8 = uVar1;
      if ((uVar15 != uVar7) && (uVar9 = (unconstr->ebo_).buf[uVar15].rep_, uVar9 >> 2 == uVar5)) {
        (m->ebo_).buf[uVar5] = '\x02' - ((uVar9 & 2) == 0);
        uVar15 = uVar15 + 1;
        bVar6 = false;
      }
      do {
        puVar2 = (m->ebo_).buf;
        if ((puVar2[uVar8 >> 2] != (uchar)('\x02' - ((uVar8 & 2) == 0))) && (bVar6)) {
          uVar10 = *(uint *)&pCVar14->field_0x8 & 0x3fffffff;
          uVar9 = uVar8;
          if (uVar10 != 1) {
            uVar12 = 1;
            do {
              uVar9 = pCVar14->lits_[uVar12].rep_;
              if ((byte)(puVar2[uVar9 >> 2] & 3) != (byte)(((uVar9 & 2) == 0) + 1U)) break;
              uVar11 = (int)uVar12 + 1;
              uVar12 = (ulong)uVar11;
              uVar9 = uVar8;
            } while (uVar10 != uVar11);
          }
          if ((pCVar14->lits_[0].rep_ ^ uVar9) < 2) {
            puVar2[uVar9 >> 2] = '\x02' - ((uVar9 & 2) == 0);
            bVar6 = false;
          }
        }
        pCVar14 = (pCVar14->data_).next;
      } while ((pCVar14 != (Clause *)0x0) && (uVar8 = pCVar14->lits_[0].rep_, uVar8 >> 2 == uVar5));
      puVar2 = (m->ebo_).buf;
      if (puVar2[uVar5] == '\x04') {
        puVar2[uVar5] = '\x05';
        local_34.rep_ = uVar1 & 0xfffffffc;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (unconstr,&local_34);
      }
    } while (pCVar14 != (Clause *)0x0);
    pLVar3 = (unconstr->ebo_).buf;
    pLVar4 = pLVar3 + uVar7;
    uVar15 = (unconstr->ebo_).size;
    if (uVar7 != uVar15) {
      lVar13 = (ulong)uVar7 << 2;
      do {
        uVar7 = *(uint *)((long)&pLVar3->rep_ + lVar13) >> 2;
        puVar2 = (m->ebo_).buf;
        if ((puVar2[uVar7] & 4) != 0) {
          puVar2[uVar7] = '\x01';
          pLVar4->rep_ = *(uint32 *)((long)&pLVar3->rep_ + lVar13);
          pLVar4 = pLVar4 + 1;
        }
        lVar13 = lVar13 + 4;
      } while ((ulong)uVar15 << 2 != lVar13);
    }
    uVar7 = (unconstr->ebo_).size;
    (unconstr->ebo_).size =
         uVar7 - (int)((long)(unconstr->ebo_).buf + ((ulong)uVar7 * 4 - (long)pLVar4) >> 2);
  }
  return;
}

Assistant:

void SatElite::doExtendModel(ValueVec& m, LitVec& unconstr) {
	if (!elimTop_) return;
	const ValueRep value_eliminated = 4u;
	// compute values of eliminated vars / blocked literals by "unit propagating"
	// eliminated/blocked clauses in reverse order
	uint32 uv = 0;
	uint32 us = unconstr.size();
	Clause* r = elimTop_;
	do {
		Literal x  = (*r)[0];
		Var last   = x.var();
		bool check = true;
		if (!r->marked()) {
			// eliminated var - compute the implied value
			m[last] = value_eliminated;
		}
		if (uv != us && unconstr[uv].var() == last) {
			// last is unconstrained w.r.t the current model -
			// set remembered value
			check   = false;
			m[last] = trueValue(unconstr[uv]);
			++uv;
		}
		do {
			Clause& c = *r;
			if (m[x.var()] != trueValue(x) && check) {
				for (uint32 i = 1, end = c.size(); i != end; ++i) {
					ValueRep vi = m[c[i].var()] & 3u;
					if (vi != falseValue(c[i])) {
						x = c[i];
						break;
					}
				}
				if (x == c[0]) {
					// all lits != x are false
					// clause is unit or conflicting
					assert(c.marked() || m[x.var()] != falseValue(x));
					m[x.var()] = trueValue(x);
					check      = false;
				}
			}
			r = r->next();
		} while (r && (x = (*r)[0]).var() == last);
		if (m[last] == value_eliminated) {
			// last seems unconstrained w.r.t the model
			m[last] |= value_true;
			unconstr.push_back(posLit(last));
		}
	} while (r);
	// check whether newly added unconstrained vars are really unconstrained w.r.t the model
	// or if they are implied by some blocked clause.
	LitVec::iterator j = unconstr.begin()+us;
	for (LitVec::iterator it = j, end = unconstr.end(); it != end; ++it) {
		if ((m[it->var()] & value_eliminated) != 0) {
			// var is unconstrained - assign to true and remember it
			// so that we can later enumerate the model containing ~var
			m[it->var()] = value_true;
			*j++ = *it;
		}
	}
	unconstr.erase(j, unconstr.end());
}